

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O3

string * duckdb::GetDefaultUserAgent_abi_cxx11_(void)

{
  string *fmt_str;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_58[0] = local_48;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"duckdb/%s(%s)","");
  fmt_str = (string *)DuckDB::LibraryVersion();
  DuckDB::Platform_abi_cxx11_();
  StringUtil::Format<char_const*,std::__cxx11::string>
            (in_RDI,(StringUtil *)local_58,fmt_str,(char *)local_38,in_R8);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return in_RDI;
}

Assistant:

const string GetDefaultUserAgent() {
	return StringUtil::Format("duckdb/%s(%s)", DuckDB::LibraryVersion(), DuckDB::Platform());
}